

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase231::run(TestCase231 *this)

{
  bool bVar1;
  Bounded<456UL,_unsigned_int> BVar2;
  Bounded<64UL,_int> local_160;
  Bounded<123ul,unsigned_char> local_159;
  Bounded<15UL,_int> local_158;
  Bounded<16ul,unsigned_char> local_154 [7];
  Bounded<123ul,unsigned_char> local_14d;
  Bounded<16UL,_unsigned_char> bar;
  bool local_149;
  int iStack_148;
  Bounded<123UL,_unsigned_char> foo;
  Bounded<123UL,_unsigned_char> succ3;
  Bounded<123UL,_unsigned_char> succ2;
  Bounded<123UL,_unsigned_char> succ1;
  bool _kj_shouldLog_4;
  Bounded<122UL,_unsigned_int> local_13c;
  uint local_138;
  DebugExpression<unsigned_int> local_134;
  undefined1 local_130 [8];
  DebugComparison<unsigned_int,_int> _kjCondition_4;
  int local_108;
  bool _kj_shouldLog_3;
  uint local_100;
  Bounded<3UL,_unsigned_int> local_fc;
  uint local_f8;
  DebugExpression<unsigned_int> local_f4;
  undefined1 local_f0 [8];
  DebugComparison<unsigned_int,_int> _kjCondition_3;
  int local_c8;
  bool _kj_shouldLog_2;
  uint local_c0;
  Bounded<56088UL,_unsigned_int> local_bc;
  uint local_b8;
  DebugExpression<unsigned_int> local_b4;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_int,_int> _kjCondition_2;
  int local_88;
  undefined1 local_83 [2];
  bool _kj_shouldLog_1;
  Bounded<456UL,_unsigned_int> local_80;
  Bounded<333UL,_unsigned_int> local_7c;
  uint local_78;
  DebugExpression<unsigned_int> local_74;
  undefined1 local_70 [8];
  DebugComparison<unsigned_int,_int> _kjCondition_1;
  int local_48;
  bool _kj_shouldLog;
  uint local_40;
  Bounded<579UL,_unsigned_int> local_3c;
  uint local_38;
  DebugExpression<unsigned_int> local_34;
  undefined1 local_30 [8];
  DebugComparison<unsigned_int,_int> _kjCondition;
  TestCase231 *this_local;
  
  _kjCondition._24_8_ = this;
  local_40 = (uint)(anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  local_3c = operator+<456UL,_123U,_unsigned_int>(local_40);
  local_38 = Bounded<579UL,_unsigned_int>::unwrap(&local_3c);
  local_34 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
  local_48 = 0x243;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_30,&local_34,&local_48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    _kjCondition_1._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<unsigned_int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(boundedValue<456>() + bounded<123>()).unwrap() == 456 + 123\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected (boundedValue<456>() + bounded<123>()).unwrap() == 456 + 123",
                 (DebugComparison<unsigned_int,_int> *)local_30);
      _kjCondition_1._31_1_ = 0;
    }
  }
  local_80 = (anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  local_7c = Bounded<456UL,_unsigned_int>::
             subtractChecked<123U,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_units_test_c__:236:3)>
                       (&local_80,local_83);
  local_78 = Bounded<333UL,_unsigned_int>::unwrap(&local_7c);
  local_74 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_78);
  local_88 = 0x14d;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_70,&local_74,&local_88);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
  if (!bVar1) {
    _kjCondition_2._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[99],kj::_::DebugComparison<unsigned_int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123\", _kjCondition"
                 ,(char (*) [99])
                  "failed: expected boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123"
                 ,(DebugComparison<unsigned_int,_int> *)local_70);
      _kjCondition_2._31_1_ = 0;
    }
  }
  local_c0 = (uint)(anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  local_bc = operator*<456UL,_123U,_unsigned_int>(local_c0);
  local_b8 = Bounded<56088UL,_unsigned_int>::unwrap(&local_bc);
  local_b4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b8);
  local_c8 = 0xdb18;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_b0,&local_b4,&local_c8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    _kjCondition_3._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<unsigned_int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(boundedValue<456>() * bounded<123>()).unwrap() == 456 * 123\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected (boundedValue<456>() * bounded<123>()).unwrap() == 456 * 123",
                 (DebugComparison<unsigned_int,_int> *)local_b0);
      _kjCondition_3._31_1_ = 0;
    }
  }
  local_100 = (uint)(anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  local_fc = operator/<456UL,_123U,_unsigned_int>(local_100);
  local_f8 = Bounded<3UL,_unsigned_int>::unwrap(&local_fc);
  local_f4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f8);
  local_108 = 3;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_f0,&local_f4,&local_108);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
  if (!bVar1) {
    _kjCondition_4._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<unsigned_int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(boundedValue<456>() / bounded<123>()).unwrap() == 456 / 123\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected (boundedValue<456>() / bounded<123>()).unwrap() == 456 / 123",
                 (DebugComparison<unsigned_int,_int> *)local_f0);
      _kjCondition_4._31_1_ = 0;
    }
  }
  BVar2 = (anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  local_13c = operator%<456UL,_123U,_unsigned_int>(BVar2.value);
  local_138 = Bounded<122UL,_unsigned_int>::unwrap(&local_13c);
  local_134 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_138);
  iStack_148 = 0x57;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_130,&local_134,&stack0xfffffffffffffeb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<unsigned_int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"(boundedValue<456>() % bounded<123>()).unwrap() == 456 % 123\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected (boundedValue<456>() % bounded<123>()).unwrap() == 456 % 123",
                 (DebugComparison<unsigned_int,_int> *)local_130);
      local_149 = false;
    }
  }
  memset(&bar,0,1);
  bounded<123u>();
  Bounded<123ul,unsigned_char>::operator=(&local_14d);
  bounded<122u>();
  Bounded<123ul,unsigned_char>::operator=(&local_14d);
  bounded<0u>();
  Bounded<123ul,unsigned_char>::operator=(&local_14d);
  local_159 = local_14d;
  bounded<3u>();
  local_158 = operator>><123UL,_3U,_unsigned_char>(local_159);
  Bounded<16ul,unsigned_char>::operator=(local_154,&local_158);
  bounded<2u>();
  local_160 = Bounded<(boundedLShift<16ul,2u>)(),decltype(((unsigned_char)())<<((unsigned_int)()))>kj
              ::operator<<(local_154[0]);
  Bounded<123ul,unsigned_char>::operator=(&local_14d,&local_160);
  return;
}

Assistant:

TEST(UnitMeasure, BoundedVsGuardedConst) {
  // TODO(someday): Some script should attempt to compile this test once with each "COMPILE ERROR"
  //   line restored to verify that they actually error out.

  KJ_EXPECT((boundedValue<456>() + bounded<123>()).unwrap() == 456 + 123);
  KJ_EXPECT(boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123);
  KJ_EXPECT((boundedValue<456>() * bounded<123>()).unwrap() == 456 * 123);
  KJ_EXPECT((boundedValue<456>() / bounded<123>()).unwrap() == 456 / 123);
  KJ_EXPECT((boundedValue<456>() % bounded<123>()).unwrap() == 456 % 123);

  {
    Bounded<123, uint8_t> succ1 KJ_UNUSED = bounded<123>();
    Bounded<123, uint8_t> succ2 KJ_UNUSED = bounded<122>();
    Bounded<123, uint8_t> succ3 KJ_UNUSED = bounded<0>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<124>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<125>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<123456>();
  }

  Bounded<123, uint8_t> foo;
  foo = bounded<123>();
  foo = bounded<122>();
  foo = bounded<0>();
  // COMPILE ERROR: foo = bounded<124>();
  // COMPILE ERROR: foo = bounded<125>();
  // COMPILE ERROR: foo = bounded<123456>();

  Bounded<16, uint8_t> bar;
  // COMPILE ERROR: bar = foo >> bounded<2>();
  bar = foo >> bounded<3>();

  // COMPILE ERROR: foo = bar << bounded<3>();
  foo = bar << bounded<2>();
}